

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

Entry * __thiscall
cali::Caliper::get(Entry *__return_storage_ptr__,Caliper *this,ChannelBody *chB,Attribute *attr)

{
  int prop;
  cali_id_t cVar1;
  Entry local_60;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> gbb;
  lock_guard<(anonymous_namespace)::siglock> g;
  cali_id_t key;
  Attribute *attr_local;
  ChannelBody *chB_local;
  Caliper *this_local;
  
  cVar1 = Attribute::id(attr);
  prop = Attribute::properties(attr);
  cVar1 = anon_unknown.dwarf_30b7b8::get_blackboard_key(cVar1,prop);
  std::lock_guard<(anonymous_namespace)::siglock>::lock_guard
            ((lock_guard<(anonymous_namespace)::siglock> *)&gbb,&this->sT->lock);
  std::lock_guard<std::mutex>::lock_guard(&local_38,&chB->channel_blackboard_lock);
  Blackboard::get(&local_60,&chB->channel_blackboard,cVar1);
  Entry::get(__return_storage_ptr__,&local_60,attr);
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard
            ((lock_guard<(anonymous_namespace)::siglock> *)&gbb);
  return __return_storage_ptr__;
}

Assistant:

Entry Caliper::get(ChannelBody* chB, const Attribute& attr)
{
    cali_id_t key = get_blackboard_key(attr.id(), attr.properties());

    std::lock_guard<::siglock> g(sT->lock);
    std::lock_guard<std::mutex> gbb(chB->channel_blackboard_lock);

    return chB->channel_blackboard.get(key).get(attr);
}